

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.h
# Opt level: O2

Node<MeshLib::Edge> * __thiscall
AVL::Node<MeshLib::Edge>::find_node(Node<MeshLib::Edge> *this,Edge *inData)

{
  EdgeKey EVar1;
  EdgeKey EVar2;
  bool bVar3;
  ulong in_RAX;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  
  while( true ) {
    EVar1 = inData->key;
    EVar2 = this->data->key;
    iVar5 = -(uint)(EVar2.m_s == EVar1.m_s);
    iVar6 = -(uint)(EVar2.m_t == EVar1.m_t);
    auVar4._4_4_ = iVar5;
    auVar4._0_4_ = iVar5;
    auVar4._8_4_ = iVar6;
    auVar4._12_4_ = iVar6;
    iVar5 = movmskpd((int)in_RAX,auVar4);
    if (iVar5 == 3) break;
    bVar3 = MeshLib::EdgeKey::operator<(&inData->key,&this->data->key);
    in_RAX = (ulong)!bVar3;
    this = (&this->left)[in_RAX];
  }
  return this;
}

Assistant:

Node<T> * find_node (T * inData) 
    {
        if (this == NULL)
            return NULL;

        if ( *inData == *data)
            return this;

        if (*inData < *data)
            return left -> find_node (inData);
        else
            return right -> find_node (inData);
    }